

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O1

Result<wallet::PreSelectedInputs> *
wallet::FetchSelectedInputs
          (Result<wallet::PreSelectedInputs> *__return_storage_ptr__,CWallet *wallet,
          CCoinControl *coin_control,CoinSelectionParams *coin_selection_params)

{
  undefined8 *puVar1;
  _Base_ptr p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  Chain *pCVar5;
  element_type *peVar6;
  pointer pCVar7;
  COutPoint outpoint;
  optional<CFeeRate> feerate;
  CAmount CVar8;
  bool can_grind_r;
  int iVar9;
  CCoinControl *pCVar10;
  _Storage<long,_true> nWeight;
  CWalletTx *pCVar11;
  mapped_type_conflict1 *pmVar12;
  CCoinControl *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  CFeeRate *pCVar13;
  size_t *psVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  char cVar16;
  pointer outpoint_00;
  int64_t iVar17;
  long in_FS_OFFSET;
  optional<long> oVar18;
  COutput output;
  optional<CTxOut> out;
  CTxOut txout;
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  map_of_bump_fees;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  vector<COutPoint,_std::allocator<COutPoint>_> local_308;
  _Storage<CFeeRate,_true> local_2f0;
  undefined1 uStack_2e8;
  undefined7 uStack_2e7;
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  local_2e0 [8];
  _Rb_tree_node_base local_2d8;
  size_t local_2b8;
  CAmount local_2b0;
  _Storage<long,_true> local_2a8 [2];
  _Storage<long,_true> local_298 [2];
  undefined1 local_288 [48];
  void *local_258;
  uint local_23c;
  bilingual_str local_208;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  uint32_t local_1a8;
  undefined1 local_198 [40];
  size_type local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  undefined8 local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  undefined1 local_138 [8];
  undefined1 local_130 [32];
  bool local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  undefined8 local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  CTxOut local_c8;
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  local_a0;
  PreSelectedInputs local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header;
  local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70.coins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70.total_amount = 0;
  local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  can_grind_r = CWallet::CanGrindR(wallet);
  pCVar5 = wallet->m_chain;
  if (pCVar5 == (Chain *)0x0) {
    __assert_fail("m_chain",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                  ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
  }
  CCoinControl::ListSelected
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)local_2a8,coin_control);
  pCVar13 = &coin_selection_params->m_effective_feerate;
  (*pCVar5->_vptr_Chain[0x17])(&local_a0,pCVar5,local_2a8);
  if ((_Storage<long,_true> *)local_2a8[0]._M_value != (_Storage<long,_true> *)0x0) {
    operator_delete((void *)local_2a8[0],local_298[0]._M_value - (long)local_2a8[0]);
  }
  CCoinControl::ListSelected(&local_308,coin_control);
  if (local_308.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_308.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
             0x10);
    pCVar10 = (CCoinControl *)
              ((__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
               super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
               super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
               super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
               super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
               super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u._M_first.
               _M_storage._M_storage + 0x30);
    outpoint_00 = local_308.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                  super__Vector_impl_data._M_start;
    do {
      oVar18 = CCoinControl::GetInputWeight(coin_control,outpoint_00);
      nWeight._M_value =
           oVar18.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
      args = (CCoinControl *)CONCAT71((int7)((ulong)pCVar13 >> 8),nWeight._M_value != -1);
      iVar17 = -1;
      if ((oVar18.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_engaged & nWeight._M_value != -1) == 1) {
        iVar17 = GetVirtualTransactionSize(nWeight._M_value,0,0);
      }
      CTxOut::CTxOut(&local_c8);
      pCVar11 = CWallet::GetWalletTx(wallet,(uint256 *)outpoint_00);
      if (pCVar11 == (CWalletTx *)0x0) {
        CCoinControl::GetExternalOutput((optional<CTxOut> *)local_138,coin_control,outpoint_00);
        cVar16 = local_110;
        if (local_110 == false) {
          local_2a8[0]._M_value = (long)local_298;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2a8,"Not found pre-selected input %s","");
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            local_288._0_8_ = local_288 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_288,"Not found pre-selected input %s","");
          }
          else {
            local_198._0_8_ = "Not found pre-selected input %s";
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_288,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_198);
          }
          COutPoint::ToString_abi_cxx11_((string *)local_198,outpoint_00);
          tinyformat::format<std::__cxx11::string>
                    ((bilingual_str *)(local_198 + 0x20),(tinyformat *)local_2a8,
                     (bilingual_str *)local_198,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
          *(undefined8 **)
           &(__return_storage_ptr__->m_variant).
            super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
            super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
            super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
            super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
            super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
            super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs> = puVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._32_8_ == &local_168) {
            *puVar1 = CONCAT71(local_168._M_allocated_capacity._1_7_,local_168._M_local_buf[0]);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
             0x18) = local_168._8_8_;
          }
          else {
            *(undefined8 *)
             &(__return_storage_ptr__->m_variant).
              super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
              super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
              super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
              super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
              super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
              super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs> =
                 local_198._32_8_;
            *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>
                              ._M_u + 0x10) =
                 CONCAT71(local_168._M_allocated_capacity._1_7_,local_168._M_local_buf[0]);
          }
          *(size_type *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 8)
               = local_170;
          *(CCoinControl **)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
           0x20) = pCVar10;
          if (local_158 == &local_148) {
            *(pointer *)
             &(pCVar10->destChange).
              super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                 = (pointer)CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]
                                    );
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
             0x38) = local_148._8_8_;
          }
          else {
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                         super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                         super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                         super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                         super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u
                 + 0x20) = local_158;
            *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>
                              ._M_u + 0x30) =
                 CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
           0x28) = local_150;
          (__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
          super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
          super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
          super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
          super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
          super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_index = '\0';
          local_148._M_local_buf[0] = '\0';
          local_150 = 0;
          local_168._M_local_buf[0] = '\0';
          local_170 = 0;
          args = pCVar10;
          local_198._32_8_ = &local_168;
          local_158 = &local_148;
          if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
            operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
          }
          if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
            operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
          }
          if ((_Storage<long,_true> *)local_2a8[0]._M_value != local_298) {
            operator_delete((void *)local_2a8[0],local_298[0]._M_value + 1);
          }
        }
        else {
          local_c8.nValue = (CAmount)local_138;
          prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                    (&local_c8.scriptPubKey.super_CScriptBase,
                     (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_130);
        }
        if ((local_110 == true) && (local_110 = false, 0x1c < (uint)local_130._28_4_)) {
          free((void *)local_130._0_8_);
          local_130._0_8_ = (char *)0x0;
        }
      }
      else {
        peVar6 = (pCVar11->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        pCVar7 = (peVar6->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (((long)(peVar6->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                          .super__Vector_impl_data._M_finish - (long)pCVar7 >> 3) *
                  -0x3333333333333333);
        args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (ulong)outpoint_00->n;
        if (pbVar15 < args_00 || (long)pbVar15 - (long)args_00 == 0) {
          local_2a8[0]._M_value = (long)local_298;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2a8,"Invalid pre-selected input %s","");
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            local_288._0_8_ = local_288 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_288,"Invalid pre-selected input %s","");
          }
          else {
            local_138 = (undefined1  [8])0x869fb8;
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_288,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_138);
          }
          COutPoint::ToString_abi_cxx11_((string *)local_138,outpoint_00);
          tinyformat::format<std::__cxx11::string>
                    ((bilingual_str *)&local_108,(tinyformat *)local_2a8,(bilingual_str *)local_138,
                     args_00);
          *(undefined8 **)
           &(__return_storage_ptr__->m_variant).
            super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
            super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
            super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
            super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
            super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
            super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs> = puVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_allocated_capacity == &local_f8) {
            *puVar1 = CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
             0x18) = local_f8._8_8_;
          }
          else {
            *(size_type *)
             &(__return_storage_ptr__->m_variant).
              super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
              super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
              super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
              super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
              super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
              super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs> =
                 local_108._M_allocated_capacity;
            *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>
                              ._M_u + 0x10) =
                 CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 8)
               = local_108._8_8_;
          *(CCoinControl **)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
           0x20) = pCVar10;
          if (local_e8 == &local_d8) {
            *(pointer *)
             &(pCVar10->destChange).
              super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                 = (pointer)CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                     super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
             0x38) = local_d8._8_8_;
          }
          else {
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                         super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                         super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                         super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                         super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u
                 + 0x20) = local_e8;
            *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                              super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>
                              ._M_u + 0x30) =
                 CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
           0x28) = local_e0;
          (__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
          super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
          super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
          super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
          super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
          super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_index = '\0';
          local_d8._M_local_buf[0] = '\0';
          local_e0 = 0;
          local_f8._M_local_buf[0] = '\0';
          local_108._8_8_ = 0;
          args = pCVar10;
          local_108._M_allocated_capacity = (size_type)&local_f8;
          local_e8 = &local_d8;
          if (local_138 != (undefined1  [8])(local_130 + 8)) {
            operator_delete((void *)local_138,local_130._8_8_ + 1);
          }
          if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
            operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
          }
          if ((_Storage<long,_true> *)local_2a8[0]._M_value != local_298) {
            operator_delete((void *)local_2a8[0],local_298[0]._M_value + 1);
          }
          cVar16 = '\0';
        }
        else {
          args = (CCoinControl *)((long)args_00 * 5);
          pCVar7 = pCVar7 + (long)args_00;
          local_c8.nValue = pCVar7->nValue;
          prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                    (&local_c8.scriptPubKey.super_CScriptBase,
                     &(pCVar7->scriptPubKey).super_CScriptBase);
          cVar16 = '\x01';
          if (iVar17 == -1) {
            iVar9 = CalculateMaximumSignedInputSize(&local_c8,wallet,coin_control);
            iVar17 = (int64_t)iVar9;
          }
        }
      }
      if (cVar16 == '\0') {
LAB_0051501a:
        if (0x1c < local_c8.scriptPubKey.super_CScriptBase._size) {
          free(local_c8.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
          local_c8.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
        }
        if (local_308.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
            super__Vector_impl_data._M_start != (COutPoint *)0x0) {
          operator_delete(local_308.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_308.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_308.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        goto LAB_0051505f;
      }
      if (iVar17 == -1) {
        local_1a8 = outpoint_00->n;
        local_1c8 = *(undefined8 *)
                     (outpoint_00->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        uStack_1c0 = *(undefined8 *)
                      ((outpoint_00->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        local_1b8 = *(undefined8 *)
                     ((outpoint_00->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        uStack_1b0 = *(undefined8 *)
                      ((outpoint_00->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        uVar20 = (undefined4)uStack_1b0;
        uVar21 = (undefined4)((ulong)uStack_1b0 >> 0x20);
        uVar19 = (undefined4)((ulong)uStack_1c0 >> 0x20);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = (char)uVar19;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
             (char)((uint)uVar19 >> 8);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
             (char)((uint)uVar19 >> 0x10);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
             (char)((uint)uVar19 >> 0x18);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_12_ =
             *(undefined1 (*) [12])
              (outpoint_00->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = (char)local_1b8;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
             (char)((ulong)local_1b8 >> 8);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
             (char)((ulong)local_1b8 >> 0x10);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
             (char)((ulong)local_1b8 >> 0x18);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
             (char)((ulong)local_1b8 >> 0x20);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
             (char)((ulong)local_1b8 >> 0x28);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
             (char)((ulong)local_1b8 >> 0x30);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
             (char)((ulong)local_1b8 >> 0x38);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = (char)uVar20;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
             (char)((uint)uVar20 >> 8);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
             (char)((uint)uVar20 >> 0x10);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
             (char)((uint)uVar20 >> 0x18);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = (char)uVar21;
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
             (char)((uint)uVar21 >> 8);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
             (char)((uint)uVar21 >> 0x10);
        outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
             (char)((uint)uVar21 >> 0x18);
        outpoint.n = local_1a8;
        args = coin_control;
        iVar9 = CalculateMaximumSignedInputSize
                          (&local_c8,outpoint,
                           &(coin_control->m_external_provider).super_SigningProvider,can_grind_r,
                           coin_control);
        iVar17 = (int64_t)iVar9;
      }
      if (iVar17 == -1) {
        local_2a8[0]._M_value = (long)local_298;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a8,"Not solvable pre-selected input %s","");
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_288._0_8_ = local_288 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_288,"Not solvable pre-selected input %s","");
        }
        else {
          local_138 = (undefined1  [8])0x869ff6;
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                     (_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_138);
        }
        COutPoint::ToString_abi_cxx11_((string *)local_138,outpoint_00);
        tinyformat::format<std::__cxx11::string>
                  (&local_208,(tinyformat *)local_2a8,(bilingual_str *)local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        *(undefined8 **)
         &(__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
          super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
          super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
          super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
          super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
          super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs> = puVar1;
        paVar3 = &local_208.original.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208.original._M_dataplus._M_p == paVar3) {
          *puVar1 = CONCAT71(local_208.original.field_2._M_allocated_capacity._1_7_,
                             local_208.original.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
           0x18) = local_208.original.field_2._8_8_;
        }
        else {
          *(pointer *)
           &(__return_storage_ptr__->m_variant).
            super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
            super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
            super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
            super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
            super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
            super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs> =
               local_208.original._M_dataplus._M_p;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                            super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                            super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                            super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                            super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                            super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>.
                            _M_u + 0x10) =
               CONCAT71(local_208.original.field_2._M_allocated_capacity._1_7_,
                        local_208.original.field_2._M_local_buf[0]);
        }
        paVar4 = &local_208.translated.field_2;
        *(size_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                 super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                 super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                 super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                 super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 8) =
             local_208.original._M_string_length;
        *(CCoinControl **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                 super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                 super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                 super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                 super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 0x20)
             = pCVar10;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208.translated._M_dataplus._M_p == paVar4) {
          *(pointer *)
           &(pCVar10->destChange).
            super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
            .
            super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
            .
            super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
            .
            super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
            .
            super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
            .
            super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               = (pointer)CONCAT71(local_208.translated.field_2._M_allocated_capacity._1_7_,
                                   local_208.translated.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
           0x38) = local_208.translated.field_2._8_8_;
        }
        else {
          *(pointer *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
           0x20) = local_208.translated._M_dataplus._M_p;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                            super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                            super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                            super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                            super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                            super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>.
                            _M_u + 0x30) =
               CONCAT71(local_208.translated.field_2._M_allocated_capacity._1_7_,
                        local_208.translated.field_2._M_local_buf[0]);
        }
        *(size_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                 super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                 super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                 super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                 super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 0x28)
             = local_208.translated._M_string_length;
        (__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
        super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
        super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
        super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
        super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
        super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_index = '\0';
        local_208.translated.field_2._M_local_buf[0] = '\0';
        local_208.translated._M_string_length = 0;
        local_208.original.field_2._M_local_buf[0] = '\0';
        local_208.original._M_string_length = 0;
        local_208.original._M_dataplus._M_p = (pointer)paVar3;
        local_208.translated._M_dataplus._M_p = (pointer)paVar4;
        if (local_138 != (undefined1  [8])(local_130 + 8)) {
          operator_delete((void *)local_138,local_130._8_8_ + 1);
        }
        if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
          operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
        }
        if ((_Storage<long,_true> *)local_2a8[0]._M_value != local_298) {
          operator_delete((void *)local_2a8[0],local_298[0]._M_value + 1);
        }
        goto LAB_0051501a;
      }
      local_2f0 = (_Storage<CFeeRate,_true>)
                  (coin_selection_params->m_effective_feerate).nSatoshisPerK;
      uStack_2e8 = 1;
      feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
      super__Optional_payload_base<CFeeRate>._9_7_ = uStack_2e7;
      feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
      super__Optional_payload_base<CFeeRate>._M_engaged = true;
      pCVar13 = (CFeeRate *)0x0;
      feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
      super__Optional_payload_base<CFeeRate>._M_payload = local_2f0;
      COutput::COutput((COutput *)local_2a8,outpoint_00,&local_c8,0,(int)iVar17,true,true,true,0,
                       false,feerate);
      pmVar12 = std::
                map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                ::at((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                      *)&local_a0,(key_type *)local_288);
      COutput::ApplyBumpFee((COutput *)local_2a8,*pmVar12);
      PreSelectedInputs::Insert
                (&local_70,(COutput *)local_2a8,coin_selection_params->m_subtract_fee_outputs);
      if (0x1c < local_23c) {
        free(local_258);
        local_258 = (void *)0x0;
      }
      if (0x1c < local_c8.scriptPubKey.super_CScriptBase._size) {
        free(local_c8.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
        local_c8.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
      }
      outpoint_00 = outpoint_00 + 1;
    } while (outpoint_00 !=
             local_308.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_308.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
      super__Vector_impl_data._M_start != (COutPoint *)0x0) {
    operator_delete(local_308.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_308.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  CVar8 = local_70.total_amount;
  if (local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    psVar14 = &local_2b8;
    local_2d8._M_color = _S_red;
    local_2d8._M_parent = (_Base_ptr)0x0;
    local_2d8._M_left = &local_2d8;
    local_2d8._M_right = &local_2d8;
  }
  else {
    psVar14 = &local_70.coins._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_2d8._M_color = local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    local_2d8._M_parent = local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_2d8._M_left = local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_2d8._M_right = local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &local_2d8;
    local_2b8 = local_70.coins._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header;
    local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_70.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  *psVar14 = 0;
  local_2b0 = local_70.total_amount;
  p_Var2 = (_Base_ptr)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                   super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 8);
  if (local_2d8._M_parent == (_Base_ptr)0x0) {
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
             super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 8) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
             super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 0x10) = 0
    ;
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
             super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 0x18) =
         p_Var2;
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
             super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 0x20) =
         p_Var2;
    psVar14 = (size_t *)
              ((long)&(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
                      super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                      super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
                      super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                      super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
                      super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u +
              0x28);
  }
  else {
    psVar14 = &local_2b8;
    *(_Rb_tree_color *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
             super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 8) =
         local_2d8._M_color;
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
             super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 0x10) =
         local_2d8._M_parent;
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
             super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 0x18) =
         local_2d8._M_left;
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
             super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 0x20) =
         local_2d8._M_right;
    (local_2d8._M_parent)->_M_parent = p_Var2;
    *(size_t *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
             super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
             super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 0x28) =
         local_2b8;
    local_2d8._M_parent = (_Base_ptr)0x0;
    local_2d8._M_left = &local_2d8;
    local_2d8._M_right = &local_2d8;
  }
  *psVar14 = 0;
  *(CAmount *)
   ((long)&(__return_storage_ptr__->m_variant).
           super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
           super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
           super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
           super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
           super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
           super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_u + 0x30) =
       CVar8;
  (__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_wallet::PreSelectedInputs>.
  super__Move_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
  super__Copy_assign_alias<bilingual_str,_wallet::PreSelectedInputs>.
  super__Move_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
  super__Copy_ctor_alias<bilingual_str,_wallet::PreSelectedInputs>.
  super__Variant_storage_alias<bilingual_str,_wallet::PreSelectedInputs>._M_index = '\x01';
  _GLOBAL__N_1::std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree(local_2e0);
LAB_0051505f:
  std::
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  ::~_Rb_tree(&local_a0);
  _GLOBAL__N_1::std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<PreSelectedInputs> FetchSelectedInputs(const CWallet& wallet, const CCoinControl& coin_control,
                                            const CoinSelectionParams& coin_selection_params)
{
    PreSelectedInputs result;
    const bool can_grind_r = wallet.CanGrindR();
    std::map<COutPoint, CAmount> map_of_bump_fees = wallet.chain().calculateIndividualBumpFees(coin_control.ListSelected(), coin_selection_params.m_effective_feerate);
    for (const COutPoint& outpoint : coin_control.ListSelected()) {
        int64_t input_bytes = coin_control.GetInputWeight(outpoint).value_or(-1);
        if (input_bytes != -1) {
            input_bytes = GetVirtualTransactionSize(input_bytes, 0, 0);
        }
        CTxOut txout;
        if (auto ptr_wtx = wallet.GetWalletTx(outpoint.hash)) {
            // Clearly invalid input, fail
            if (ptr_wtx->tx->vout.size() <= outpoint.n) {
                return util::Error{strprintf(_("Invalid pre-selected input %s"), outpoint.ToString())};
            }
            txout = ptr_wtx->tx->vout.at(outpoint.n);
            if (input_bytes == -1) {
                input_bytes = CalculateMaximumSignedInputSize(txout, &wallet, &coin_control);
            }
        } else {
            // The input is external. We did not find the tx in mapWallet.
            const auto out{coin_control.GetExternalOutput(outpoint)};
            if (!out) {
                return util::Error{strprintf(_("Not found pre-selected input %s"), outpoint.ToString())};
            }

            txout = *out;
        }

        if (input_bytes == -1) {
            input_bytes = CalculateMaximumSignedInputSize(txout, outpoint, &coin_control.m_external_provider, can_grind_r, &coin_control);
        }

        if (input_bytes == -1) {
            return util::Error{strprintf(_("Not solvable pre-selected input %s"), outpoint.ToString())}; // Not solvable, can't estimate size for fee
        }

        /* Set some defaults for depth, spendable, solvable, safe, time, and from_me as these don't matter for preset inputs since no selection is being done. */
        COutput output(outpoint, txout, /*depth=*/ 0, input_bytes, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, coin_selection_params.m_effective_feerate);
        output.ApplyBumpFee(map_of_bump_fees.at(output.outpoint));
        result.Insert(output, coin_selection_params.m_subtract_fee_outputs);
    }
    return result;
}